

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_false(void)

{
  bool v;
  uchar (*in_RDX) [1];
  undefined1 local_57;
  undefined1 local_56 [14];
  undefined1 local_48 [8];
  basic_variable<std::allocator<char>_> result;
  bintoken local_9 [8];
  value_type input [1];
  
  local_9[0] = (bintoken)0x80;
  trial::protocol::bintoken::parse<unsigned_char[1],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_48,local_9,in_RDX);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::same<bool>
                ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_impl
            ("result.same<bool>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x2c,"void parser_suite::parse_false()",v);
  local_56[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_57 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("result.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x2d,"void parser_suite::parse_false()",local_56,&local_57);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void parse_false()
{
    const value_type input[] = { bintoken::token::code::false_value };
    auto result = bintoken::parse(input);
    TRIAL_PROTOCOL_TEST(result.same<bool>());
    TRIAL_PROTOCOL_TEST_EQUAL(result.value<bool>(), false);
}